

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void renameTableFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  sqlite3 *db;
  sqlite3_xauth p_Var1;
  TriggerStep *pTVar2;
  FKey *pFVar3;
  int iVar4;
  uchar *zDatabase;
  uchar *zSql;
  uchar *zName;
  uchar *zNew;
  i64 iVar5;
  uchar *zDb;
  char *pcVar6;
  TriggerStep **ppTVar7;
  FKey **ppFVar8;
  uint uVar9;
  RenameCtx sCtx;
  Walker local_238;
  Parse sParse;
  NameContext local_68;
  
  db = context->pOut->db;
  zDatabase = sqlite3_value_text(*argv);
  zSql = sqlite3_value_text(argv[3]);
  zName = sqlite3_value_text(argv[4]);
  zNew = sqlite3_value_text(argv[5]);
  iVar5 = sqlite3VdbeIntValue(argv[6]);
  if (zNew == (uchar *)0x0 || (zName == (uchar *)0x0 || zSql == (uchar *)0x0)) {
    return;
  }
  p_Var1 = db->xAuth;
  db->xAuth = (sqlite3_xauth)0x0;
  sqlite3BtreeEnterAll(db);
  sCtx.pTab = (Table *)0x0;
  sCtx.zOld = (char *)0x0;
  sCtx.pList = (RenameToken *)0x0;
  sCtx.nList = 0;
  sCtx.iCol = 0;
  sCtx.pTab = sqlite3FindTable(db,(char *)zName,(char *)zDatabase);
  local_238.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_238.walkerDepth = 0;
  local_238.eCode = '\0';
  local_238._37_3_ = 0;
  local_238.pParse = &sParse;
  local_238.xExprCallback = renameTableExprCb;
  local_238.xSelectCallback = renameTableSelectCb;
  local_238.u.pNC = (NameContext *)&sCtx;
  iVar4 = renameParseSql(local_238.pParse,(char *)zDatabase,1,db,(char *)zSql,(int)iVar5);
  if (iVar4 == 0) {
    uVar9 = (uint)db->flags;
    if (sParse.pNewTable == (Table *)0x0) {
      if (sParse.pNewIndex == (Index *)0x0) {
        pcVar6 = (sParse.pNewTrigger)->table;
        iVar4 = sqlite3_stricmp(pcVar6,(char *)zName);
        if ((iVar4 == 0) && ((sCtx.pTab)->pSchema == (sParse.pNewTrigger)->pTabSchema)) {
          renameTokenFind(&sParse,&sCtx,pcVar6);
        }
        if ((uVar9 >> 0x1a & 1) == 0) {
          zDb = (uchar *)0x0;
          if ((int)iVar5 == 0) {
            zDb = zDatabase;
          }
          iVar4 = renameResolveTrigger(&sParse,(char *)zDb);
          if (iVar4 != 0) goto LAB_001acdea;
          renameWalkTrigger(&local_238,sParse.pNewTrigger);
          ppTVar7 = &(sParse.pNewTrigger)->step_list;
          while (pTVar2 = *ppTVar7, pTVar2 != (TriggerStep *)0x0) {
            pcVar6 = pTVar2->zTarget;
            if ((pcVar6 != (char *)0x0) &&
               (iVar4 = sqlite3StrICmp(pcVar6,(char *)zName), iVar4 == 0)) {
              renameTokenFind(&sParse,&sCtx,pcVar6);
            }
            ppTVar7 = &pTVar2->pNext;
          }
        }
      }
      else {
        renameTokenFind(&sParse,&sCtx,(sParse.pNewIndex)->zName);
        if ((uVar9 >> 0x1a & 1) == 0) {
          sqlite3WalkExpr(&local_238,(sParse.pNewIndex)->pPartIdxWhere);
        }
      }
    }
    else if ((sParse.pNewTable)->pSelect == (Select *)0x0) {
      if (((byte)(db->flags >> 0x1a) & 0x3f & (uVar9 >> 0xe & 1) == 0) == 0) {
        ppFVar8 = &(sParse.pNewTable)->pFKey;
        while (pFVar3 = *ppFVar8, pFVar3 != (FKey *)0x0) {
          pcVar6 = pFVar3->zTo;
          iVar4 = sqlite3_stricmp(pcVar6,(char *)zName);
          if (iVar4 == 0) {
            renameTokenFind(&sParse,&sCtx,pcVar6);
          }
          ppFVar8 = &pFVar3->pNextFrom;
        }
      }
      pcVar6 = (sParse.pNewTable)->zName;
      iVar4 = sqlite3_stricmp((char *)zName,pcVar6);
      if (iVar4 == 0) {
        sCtx.pTab = sParse.pNewTable;
        if ((uVar9 >> 0x1a & 1) == 0) {
          sqlite3WalkExprList(&local_238,(sParse.pNewTable)->pCheck);
          pcVar6 = (sParse.pNewTable)->zName;
        }
        renameTokenFind(&sParse,&sCtx,pcVar6);
      }
    }
    else if ((uVar9 >> 0x1a & 1) == 0) {
      local_68.ncFlags = 0;
      local_68._44_4_ = 0;
      local_68.pWinSelect = (Select *)0x0;
      local_68.pNext = (NameContext *)0x0;
      local_68.nRef = 0;
      local_68.nErr = 0;
      local_68.pSrcList = (SrcList *)0x0;
      local_68.uNC.pEList = (ExprList *)0x0;
      local_68.pParse = &sParse;
      sqlite3SelectPrep(&sParse,(sParse.pNewTable)->pSelect,&local_68);
      sqlite3WalkSelect(&local_238,(sParse.pNewTable)->pSelect);
      iVar4 = sParse.rc;
      if (sParse.rc != 0 && sParse.nErr != 0) goto LAB_001acdea;
    }
    iVar4 = renameEditSql(context,&sCtx,(char *)zSql,(char *)zNew,1);
    if (iVar4 == 0) goto LAB_001ace23;
  }
LAB_001acdea:
  if (sParse.zErrMsg == (char *)0x0) {
    sqlite3_result_error_code(context,iVar4);
  }
  else {
    renameColumnParseError(context,0,argv[1],argv[2],&sParse);
  }
LAB_001ace23:
  renameParseCleanup(&sParse);
  renameTokenFree(db,sCtx.pList);
  sqlite3BtreeLeaveAll(db);
  db->xAuth = p_Var1;
  return;
}

Assistant:

static void renameTableFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zDb = (const char*)sqlite3_value_text(argv[0]);
  const char *zInput = (const char*)sqlite3_value_text(argv[3]);
  const char *zOld = (const char*)sqlite3_value_text(argv[4]);
  const char *zNew = (const char*)sqlite3_value_text(argv[5]);
  int bTemp = sqlite3_value_int(argv[6]);
  UNUSED_PARAMETER(NotUsed);

  if( zInput && zOld && zNew ){
    Parse sParse;
    int rc;
    int bQuote = 1;
    RenameCtx sCtx;
    Walker sWalker;

#ifndef SQLITE_OMIT_AUTHORIZATION
    sqlite3_xauth xAuth = db->xAuth;
    db->xAuth = 0;
#endif

    sqlite3BtreeEnterAll(db);

    memset(&sCtx, 0, sizeof(RenameCtx));
    sCtx.pTab = sqlite3FindTable(db, zOld, zDb);
    memset(&sWalker, 0, sizeof(Walker));
    sWalker.pParse = &sParse;
    sWalker.xExprCallback = renameTableExprCb;
    sWalker.xSelectCallback = renameTableSelectCb;
    sWalker.u.pRename = &sCtx;

    rc = renameParseSql(&sParse, zDb, 1, db, zInput, bTemp);

    if( rc==SQLITE_OK ){
      int isLegacy = (db->flags & SQLITE_LegacyAlter);
      if( sParse.pNewTable ){
        Table *pTab = sParse.pNewTable;

        if( pTab->pSelect ){
          if( isLegacy==0 ){
            NameContext sNC;
            memset(&sNC, 0, sizeof(sNC));
            sNC.pParse = &sParse;

            sqlite3SelectPrep(&sParse, pTab->pSelect, &sNC);
            if( sParse.nErr ) rc = sParse.rc;
            sqlite3WalkSelect(&sWalker, pTab->pSelect);
          }
        }else{
          /* Modify any FK definitions to point to the new table. */
#ifndef SQLITE_OMIT_FOREIGN_KEY
          if( isLegacy==0 || (db->flags & SQLITE_ForeignKeys) ){
            FKey *pFKey;
            for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
              if( sqlite3_stricmp(pFKey->zTo, zOld)==0 ){
                renameTokenFind(&sParse, &sCtx, (void*)pFKey->zTo);
              }
            }
          }
#endif

          /* If this is the table being altered, fix any table refs in CHECK
          ** expressions. Also update the name that appears right after the
          ** "CREATE [VIRTUAL] TABLE" bit. */
          if( sqlite3_stricmp(zOld, pTab->zName)==0 ){
            sCtx.pTab = pTab;
            if( isLegacy==0 ){
              sqlite3WalkExprList(&sWalker, pTab->pCheck);
            }
            renameTokenFind(&sParse, &sCtx, pTab->zName);
          }
        }
      }

      else if( sParse.pNewIndex ){
        renameTokenFind(&sParse, &sCtx, sParse.pNewIndex->zName);
        if( isLegacy==0 ){
          sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
        }
      }

#ifndef SQLITE_OMIT_TRIGGER
      else{
        Trigger *pTrigger = sParse.pNewTrigger;
        TriggerStep *pStep;
        if( 0==sqlite3_stricmp(sParse.pNewTrigger->table, zOld) 
            && sCtx.pTab->pSchema==pTrigger->pTabSchema
          ){
          renameTokenFind(&sParse, &sCtx, sParse.pNewTrigger->table);
        }

        if( isLegacy==0 ){
          rc = renameResolveTrigger(&sParse, bTemp ? 0 : zDb);
          if( rc==SQLITE_OK ){
            renameWalkTrigger(&sWalker, pTrigger);
            for(pStep=pTrigger->step_list; pStep; pStep=pStep->pNext){
              if( pStep->zTarget && 0==sqlite3_stricmp(pStep->zTarget, zOld) ){
                renameTokenFind(&sParse, &sCtx, pStep->zTarget);
              }
            }
          }
        }
      }
#endif
    }

    if( rc==SQLITE_OK ){
      rc = renameEditSql(context, &sCtx, zInput, zNew, bQuote);
    }
    if( rc!=SQLITE_OK ){
      if( sParse.zErrMsg ){
        renameColumnParseError(context, 0, argv[1], argv[2], &sParse);
      }else{
        sqlite3_result_error_code(context, rc);
      }
    }

    renameParseCleanup(&sParse);
    renameTokenFree(db, sCtx.pList);
    sqlite3BtreeLeaveAll(db);
#ifndef SQLITE_OMIT_AUTHORIZATION
    db->xAuth = xAuth;
#endif
  }

  return;
}